

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primeextractor.cpp
# Opt level: O2

long __thiscall PrimeExtractor::findNextStep(PrimeExtractor *this)

{
  long lVar1;
  ulong __n;
  reference rVar2;
  
  __n = this->lastStep;
  lVar1 = __n * 2 + 1;
  do {
    __n = __n + 1;
    if ((ulong)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
        ((long)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
        (long)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <= __n) {
      return 0;
    }
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->primeCand,__n);
    lVar1 = lVar1 + 2;
  } while ((*rVar2._M_p & rVar2._M_mask) == 0);
  this->lastStep = __n;
  return lVar1;
}

Assistant:

long PrimeExtractor::findNextStep()
{
  for (long i = this->lastStep +1; i < this->primeCand.size(); i++) {
    if (this->primeCand[i] == true) {
      this->lastStep = i;
      return i*2+1 ;
    } 
  }
  return 0;
}